

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

base_learner * log_multi_setup(options_i *options,vw *all)

{
  bool bVar1;
  byte bVar2;
  pointer plVar3;
  loss_function *plVar4;
  ulong uVar5;
  single_learner *this;
  learner<log_multi,_example> *this_00;
  long in_RSI;
  long *in_RDI;
  learner<log_multi,_example> *l;
  float loss_parameter;
  string loss_function;
  option_group_definition new_options;
  free_ptr<log_multi> data;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  vw *in_stack_fffffffffffff790;
  string *in_stack_fffffffffffff798;
  _func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *predict;
  typed_option<unsigned_int> *in_stack_fffffffffffff7a0;
  learner<char,_example> *in_stack_fffffffffffff7a8;
  learner<log_multi,_example> *f;
  prediction_type_t pred_type;
  typed_option<bool> *in_stack_fffffffffffff7d8;
  option_group_definition *in_stack_fffffffffffff7e0;
  log_multi *d;
  string local_748 [32];
  undefined4 local_728;
  allocator local_721;
  string local_720 [32];
  undefined4 local_700;
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [32];
  learner<char,_char> *in_stack_fffffffffffff950;
  string local_6a8 [68];
  float in_stack_fffffffffffff99c;
  string *in_stack_fffffffffffff9a0;
  vw *in_stack_fffffffffffff9a8;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [359];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [359];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_int> local_1d8 [2];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [16];
  long local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<log_multi>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Logarithmic Time Multiclass Tree",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff790,
             (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"log_multi",&local_1f9);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30bb98);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff798,(uint *)in_stack_fffffffffffff790)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Use online tree for multiclass",&local_221);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790,
             (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff7e0,(typed_option<unsigned_int> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"no_progress",&local_389);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30bc96);
  VW::config::make_option<bool>(in_stack_fffffffffffff798,(bool *)in_stack_fffffffffffff790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"disable progressive validation",&local_3b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff790,
             (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff790,
             (typed_option<bool> *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"swap_resistance",&local_519);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30bd7c);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff798,(uint *)in_stack_fffffffffffff790)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            (in_stack_fffffffffffff7a0,(uint)((ulong)in_stack_fffffffffffff798 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"disable progressive validation",&local_541);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790,
             (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff7e0,(typed_option<unsigned_int> *)in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"swap_resistance",(allocator *)&stack0xfffffffffffff957);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30be7e);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff798,(uint *)in_stack_fffffffffffff790)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            (in_stack_fffffffffffff7a0,(uint)((ulong)in_stack_fffffffffffff798 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"higher = more resistance to swap, default=4",&local_6d1);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790,
             (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790,
             (typed_option<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff7e0,(typed_option<unsigned_int> *)in_stack_fffffffffffff7d8);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff957);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff790);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_10)(local_10,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"log_multi",&local_6f9);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_6f8);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30c564);
    bVar1 = plVar3->progress;
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30c577);
    plVar3->progress = (bool)(~bVar1 & 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"quantile",&local_721);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    local_728 = 0x3f000000;
    d = *(log_multi **)(local_18 + 0x3548);
    if (d != (log_multi *)0x0) {
      (**(code **)(*(long *)d + 0x48))();
    }
    std::__cxx11::string::string(local_748,local_720);
    plVar4 = getLossFunction(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                             in_stack_fffffffffffff99c);
    *(loss_function **)(local_18 + 0x3548) = plVar4;
    std::__cxx11::string::~string(local_748);
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30c66a);
    uVar5 = (ulong)(plVar3->k - 1);
    plVar3 = std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
                       ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30c67d);
    plVar3->max_predictors = uVar5;
    std::unique_ptr<log_multi,_void_(*)(void_*)>::get
              ((unique_ptr<log_multi,_void_(*)(void_*)> *)in_stack_fffffffffffff790);
    pred_type = (prediction_type_t)uVar5;
    init_tree(d);
    setup_base((options_i *)in_stack_fffffffffffff798,in_stack_fffffffffffff790);
    this = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff950);
    in_stack_fffffffffffff7a0 = *(typed_option<unsigned_int> **)(local_18 + 8);
    predict = (_func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    std::unique_ptr<log_multi,_void_(*)(void_*)>::operator->
              ((unique_ptr<log_multi,_void_(*)(void_*)> *)0x30c6ea);
    this_00 = LEARNER::init_multiclass_learner<log_multi,example,LEARNER::learner<char,example>>
                        ((free_ptr<log_multi> *)this,in_stack_fffffffffffff7a8,
                         (_func_void_log_multi_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff7a0,predict,(parser *)in_stack_fffffffffffff790,
                         CONCAT44(in_stack_fffffffffffff78c,4),pred_type);
    f = this_00;
    LEARNER::learner<log_multi,_example>::set_save_load(this_00,save_load_tree);
    LEARNER::learner<log_multi,_example>::set_finish
              ((learner<log_multi,_example> *)this,(_func_void_log_multi_ptr *)f);
    in_stack_fffffffffffff790 = (vw *)LEARNER::make_base<log_multi,example>(this_00);
    local_700 = 1;
    local_8 = in_stack_fffffffffffff790;
    std::__cxx11::string::~string(local_720);
  }
  else {
    local_8 = (vw *)0x0;
    local_700 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff790);
  std::unique_ptr<log_multi,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<log_multi,_void_(*)(void_*)> *)in_stack_fffffffffffff7a0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* log_multi_setup(options_i& options, vw& all)  // learner setup
{
  auto data = scoped_calloc_or_throw<log_multi>();
  option_group_definition new_options("Logarithmic Time Multiclass Tree");
  new_options.add(make_option("log_multi", data->k).keep().help("Use online tree for multiclass"))
      .add(make_option("no_progress", data->progress).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist).default_value(4).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist)
               .default_value(4)
               .help("higher = more resistance to swap, default=4"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("log_multi"))
    return nullptr;

  data->progress = !data->progress;

  string loss_function = "quantile";
  float loss_parameter = 0.5;
  delete (all.loss);
  all.loss = getLossFunction(all, loss_function, loss_parameter);

  data->max_predictors = data->k - 1;
  init_tree(*data.get());

  learner<log_multi, example>& l = init_multiclass_learner(
      data, as_singleline(setup_base(options, all)), learn, predict, all.p, data->max_predictors);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}